

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Aig_Man_t *
Aig_ManChoicePartitioned(Vec_Ptr_t *vAigs,int nPartSize,int nConfMax,int nLevelMax,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Aig_Man_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Man_t *pAVar8;
  Vec_Ptr_t *p;
  void *pvVar9;
  long *plVar10;
  Vec_Int_t *p_00;
  Vec_Int_t *vPart_00;
  Aig_Man_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  void *pvVar13;
  undefined8 *puVar14;
  Aig_Obj_t *pAVar15;
  Tim_Man_t *pTVar16;
  int local_90;
  int local_8c;
  int nIdMax;
  int m;
  int k;
  int i;
  void **ppData;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vParts;
  Vec_Int_t *vPartSupp;
  Vec_Int_t *vPart;
  Aig_Man_t *pTemp;
  Aig_Man_t *pAig;
  Aig_Man_t *pAigPart;
  Aig_Man_t *pAigTotal;
  Vec_Ptr_t *vOuts;
  Vec_Ptr_t *vOutsTotal;
  Vec_Ptr_t *vPios;
  int fVerbose_local;
  int nLevelMax_local;
  int nConfMax_local;
  int nPartSize_local;
  Vec_Ptr_t *vAigs_local;
  
  iVar1 = Vec_PtrSize(vAigs);
  if (iVar1 < 2) {
    __assert_fail("Vec_PtrSize(vAigs) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPart.c"
                  ,0x4ed,"Aig_Man_t *Aig_ManChoicePartitioned(Vec_Ptr_t *, int, int, int, int)");
  }
  local_90 = 0;
  for (m = 0; iVar1 = Vec_PtrSize(vAigs), m < iVar1; m = m + 1) {
    pAVar6 = (Aig_Man_t *)Vec_PtrEntry(vAigs,m);
    iVar1 = Aig_ManObjNumMax(pAVar6);
    local_90 = iVar1 + local_90;
  }
  pAVar6 = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
  pVVar7 = Aig_ManPartitionSmart(pAVar6,nPartSize,0,(Vec_Ptr_t **)0x0);
  pAVar8 = Aig_ManStartFrom(pAVar6);
  Aig_ManReprStart(pAVar8,local_90);
  iVar1 = Aig_ManCoNum(pAVar6);
  p = Vec_PtrStart(iVar1);
  for (m = 0; iVar1 = Vec_PtrSize(vAigs), m < iVar1; m = m + 1) {
    pvVar9 = Vec_PtrEntry(vAigs,m);
    for (nIdMax = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar9 + 0x10)), nIdMax < iVar1;
        nIdMax = nIdMax + 1) {
      plVar10 = (long *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar9 + 0x10),nIdMax);
      *plVar10 = (long)nIdMax;
    }
  }
  p_00 = Vec_IntAlloc(100);
  m = 0;
  do {
    iVar1 = Vec_PtrSize(pVVar7);
    if (iVar1 <= m) {
      if (fVerbose != 0) {
        printf(
              "                                                                                          \r"
              );
      }
      Vec_VecFree((Vec_Vec_t *)pVVar7);
      Vec_IntFree(p_00);
      for (m = 0; iVar1 = Vec_PtrSize(vAigs), m < iVar1; m = m + 1) {
        pvVar9 = Vec_PtrEntry(vAigs,m);
        for (nIdMax = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar9 + 0x10)), nIdMax < iVar1;
            nIdMax = nIdMax + 1) {
          puVar14 = (undefined8 *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar9 + 0x10),nIdMax);
          *puVar14 = 0;
        }
      }
      for (m = 0; iVar1 = Vec_PtrSize(p), m < iVar1; m = m + 1) {
        pAVar15 = (Aig_Obj_t *)Vec_PtrEntry(p,m);
        Aig_ObjCreateCo(pAVar8,pAVar15);
      }
      Vec_PtrFree(p);
      pAVar6 = Aig_ManRehash(pAVar8);
      Aig_ManMarkValidChoices(pAVar6);
      pAVar8 = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
      pVVar7 = Aig_ManOrderPios(pAVar6,pAVar8);
      pAVar8 = Aig_ManDupDfsGuided(pAVar6,pVVar7);
      Aig_ManStop(pAVar6);
      Vec_PtrFree(pVVar7);
      pvVar9 = Vec_PtrEntry(vAigs,0);
      if (*(long *)((long)pvVar9 + 0x160) != 0) {
        pTVar16 = Tim_ManDup(*(Tim_Man_t **)((long)pvVar9 + 0x160),0);
        pAVar8->pManTime = pTVar16;
      }
      Aig_ManChoiceLevel(pAVar8);
      return pAVar8;
    }
    vPart_00 = (Vec_Int_t *)Vec_PtrEntry(pVVar7,m);
    pAVar6 = Aig_ManStart(5000);
    Vec_IntClear(p_00);
    for (nIdMax = 0; iVar1 = Vec_PtrSize(vAigs), nIdMax < iVar1; nIdMax = nIdMax + 1) {
      pAVar11 = (Aig_Man_t *)Vec_PtrEntry(vAigs,nIdMax);
      pVVar12 = Aig_ManDupPart(pAVar6,pAVar11,vPart_00,p_00,0);
      if (nIdMax == 0) {
        for (local_8c = 0; iVar1 = Vec_PtrSize(pVVar12), local_8c < iVar1; local_8c = local_8c + 1)
        {
          pAVar15 = (Aig_Obj_t *)Vec_PtrEntry(pVVar12,local_8c);
          Aig_ObjCreateCo(pAVar6,pAVar15);
        }
      }
      Vec_PtrFree(pVVar12);
    }
    pVVar12 = Aig_ManDupPart(pAVar8,pAVar6,vPart_00,p_00,1);
    for (nIdMax = 0; iVar1 = Vec_PtrSize(pVVar12), nIdMax < iVar1; nIdMax = nIdMax + 1) {
      pvVar9 = Vec_PtrEntry(pVVar12,nIdMax);
      iVar1 = Vec_IntEntry(vPart_00,nIdMax);
      pvVar13 = Vec_PtrEntry(p,iVar1);
      if (pvVar13 != (void *)0x0) {
        __assert_fail("Vec_PtrEntry( vOutsTotal, Vec_IntEntry(vPart,k) ) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPart.c"
                      ,0x51b,"Aig_Man_t *Aig_ManChoicePartitioned(Vec_Ptr_t *, int, int, int, int)")
        ;
      }
      iVar1 = Vec_IntEntry(vPart_00,nIdMax);
      Vec_PtrWriteEntry(p,iVar1,pvVar9);
    }
    Vec_PtrFree(pVVar12);
    iVar1 = Aig_ManObjNumMax(pAVar6);
    pvVar9 = malloc((long)iVar1 << 3);
    for (nIdMax = 0; iVar1 = Vec_PtrSize(pAVar6->vObjs), nIdMax < iVar1; nIdMax = nIdMax + 1) {
      pvVar13 = Vec_PtrEntry(pAVar6->vObjs,nIdMax);
      if (pvVar13 != (void *)0x0) {
        *(undefined8 *)((long)pvVar9 + (long)nIdMax * 8) = *(undefined8 *)((long)pvVar13 + 0x28);
      }
    }
    if (fVerbose != 0) {
      uVar2 = Vec_PtrSize(pVVar7);
      uVar3 = Aig_ManCiNum(pAVar6);
      uVar4 = Aig_ManCoNum(pAVar6);
      uVar5 = Aig_ManNodeNum(pAVar6);
      iVar1 = Aig_ManLevelNum(pAVar6);
      printf("Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",(ulong)(m + 1),
             (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,iVar1);
    }
    pAVar11 = Fra_FraigChoice(pAVar6,nConfMax,nLevelMax);
    Aig_ManStop(pAVar11);
    for (nIdMax = 0; iVar1 = Vec_PtrSize(pAVar6->vObjs), nIdMax < iVar1; nIdMax = nIdMax + 1) {
      pvVar13 = Vec_PtrEntry(pAVar6->vObjs,nIdMax);
      if (pvVar13 != (void *)0x0) {
        *(undefined8 *)((long)pvVar13 + 0x28) = *(undefined8 *)((long)pvVar9 + (long)nIdMax * 8);
      }
    }
    if (pvVar9 != (void *)0x0) {
      free(pvVar9);
    }
    if (pAVar6->pReprs != (Aig_Obj_t **)0x0) {
      Aig_ManTransferRepr(pAVar8,pAVar6);
    }
    Aig_ManStop(pAVar6);
    m = m + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManChoicePartitioned( Vec_Ptr_t * vAigs, int nPartSize, int nConfMax, int nLevelMax, int fVerbose )
{
//    extern int Cmd_CommandExecute( void * pAbc, char * sCommand );
//    extern void * Abc_FrameGetGlobalFrame();
//    extern Aig_Man_t * Fra_FraigChoice( Aig_Man_t * pManAig, int nConfMax, int nLevelMax );

    Vec_Ptr_t * vPios;
    Vec_Ptr_t * vOutsTotal, * vOuts;
    Aig_Man_t * pAigTotal, * pAigPart, * pAig, * pTemp;
    Vec_Int_t * vPart, * vPartSupp;
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    void ** ppData;
    int i, k, m, nIdMax;
    assert( Vec_PtrSize(vAigs) > 1 );

    // compute the total number of IDs
    nIdMax = 0;
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        nIdMax += Aig_ManObjNumMax(pAig);

    // partition the first AIG in the array
    pAig = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    vParts = Aig_ManPartitionSmart( pAig, nPartSize, 0, NULL );

    // start the total fraiged AIG
    pAigTotal = Aig_ManStartFrom( pAig );
    Aig_ManReprStart( pAigTotal, nIdMax );
    vOutsTotal = Vec_PtrStart( Aig_ManCoNum(pAig) );

    // set the PI numbers
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        Aig_ManForEachCi( pAig, pObj, k )
            pObj->pNext = (Aig_Obj_t *)(long)k;

//    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // create the total fraiged AIG
    vPartSupp = Vec_IntAlloc( 100 ); // maps part PI num into total PI num
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        // derive the partition AIG
        pAigPart = Aig_ManStart( 5000 );
//        pAigPart->pName = Extra_UtilStrsav( pAigPart->pName );
        Vec_IntClear( vPartSupp );
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, k )
        {
            vOuts = Aig_ManDupPart( pAigPart, pAig, vPart, vPartSupp, 0 );
            if ( k == 0 )
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, m )
                    Aig_ObjCreateCo( pAigPart, pObj );
            }
            Vec_PtrFree( vOuts );
        }
        // derive the total AIG from the partitioned AIG
        vOuts = Aig_ManDupPart( pAigTotal, pAigPart, vPart, vPartSupp, 1 );
        // add to the outputs
        Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, k )
        {
            assert( Vec_PtrEntry( vOutsTotal, Vec_IntEntry(vPart,k) ) == NULL );
            Vec_PtrWriteEntry( vOutsTotal, Vec_IntEntry(vPart,k), pObj );
        }
        Vec_PtrFree( vOuts );
        // store contents of pData pointers
        ppData = ABC_ALLOC( void *, Aig_ManObjNumMax(pAigPart) );
        Aig_ManForEachObj( pAigPart, pObj, k )
            ppData[k] = pObj->pData;
        // report the process
        if ( fVerbose )
        printf( "Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), 
            Aig_ManNodeNum(pAigPart), Aig_ManLevelNum(pAigPart) );
        // compute equivalence classes (to be stored in pNew->pReprs)
        pAig = Fra_FraigChoice( pAigPart, nConfMax, nLevelMax );
        Aig_ManStop( pAig );
        // reset the pData pointers
        Aig_ManForEachObj( pAigPart, pObj, k )
            pObj->pData = ppData[k];
        ABC_FREE( ppData );
        // transfer representatives to the total AIG
        if ( pAigPart->pReprs )
            Aig_ManTransferRepr( pAigTotal, pAigPart );
        Aig_ManStop( pAigPart );
    }
    if ( fVerbose )
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_IntFree( vPartSupp );

//    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // clear the PI numbers
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        Aig_ManForEachCi( pAig, pObj, k )
            pObj->pNext = NULL;

    // add the outputs in the same order
    Vec_PtrForEachEntry( Aig_Obj_t *, vOutsTotal, pObj, i )
        Aig_ObjCreateCo( pAigTotal, pObj );
    Vec_PtrFree( vOutsTotal );

    // derive the result of choicing
    pAig = Aig_ManRehash( pAigTotal );
    // create the equivalent nodes lists
    Aig_ManMarkValidChoices( pAig );
    // reconstruct the network
    vPios = Aig_ManOrderPios( pAig, (Aig_Man_t *)Vec_PtrEntry(vAigs,0) );
    pAig = Aig_ManDupDfsGuided( pTemp = pAig, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );
    // duplicate the timing manager
    pTemp = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    if ( pTemp->pManTime )
        pAig->pManTime = Tim_ManDup( (Tim_Man_t *)pTemp->pManTime, 0 );
    // reset levels
    Aig_ManChoiceLevel( pAig );
    return pAig;
}